

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O1

bool __thiscall xercesc_4_0::XMLReader::getName(XMLReader *this,XMLBuffer *toFill,bool token)

{
  bool bVar1;
  XMLSize_t XVar2;
  ulong uVar3;
  XMLSize_t XVar4;
  
  if ((this->fCharIndex == this->fCharsAvail) && (bVar1 = refreshCharBuffer(this), !bVar1)) {
    return false;
  }
  XVar4 = this->fCharIndex;
  if (!token) {
    if ((ushort)(this->fCharBuf[XVar4] + L'⠀') < 0x380) {
      if (XVar4 + 1 == this->fCharsAvail) {
        bVar1 = refreshCharBuffer(this);
        if (!bVar1) {
          return false;
        }
        XVar4 = this->fCharIndex;
      }
      if ((ushort)(this->fCharBuf[this->fCharIndex + 1] + L'\x2000') < 0xfc00) {
        return false;
      }
      XVar2 = this->fCharIndex + 2;
    }
    else {
      if ((this->fgCharCharsTable[(ushort)this->fCharBuf[XVar4]] & 2) == 0) {
        return false;
      }
      XVar2 = XVar4 + 1;
    }
    this->fCharIndex = XVar2;
  }
  do {
    uVar3 = this->fCharIndex;
    while (uVar3 < this->fCharsAvail) {
      if ((ushort)(this->fCharBuf[uVar3] + L'⠀') < 0x380) {
        if (uVar3 + 1 == this->fCharsAvail) {
          XVar2 = uVar3 - XVar4;
          if (XVar2 != 0) {
            this->fCurCol = this->fCurCol + XVar2;
            XMLBuffer::append(toFill,this->fCharBuf + XVar4,XVar2);
          }
          bVar1 = refreshCharBuffer(this);
          if (!bVar1) break;
          XVar4 = this->fCharIndex;
        }
        if ((ushort)(this->fCharBuf[this->fCharIndex + 1] + L'\x2000') < 0xfc00) break;
        uVar3 = this->fCharIndex + 2;
      }
      else {
        if ((this->fgCharCharsTable[(ushort)this->fCharBuf[uVar3]] & 4) == 0) break;
        uVar3 = uVar3 + 1;
      }
      this->fCharIndex = uVar3;
    }
    XVar2 = this->fCharIndex - XVar4;
    if (XVar2 != 0) {
      this->fCurCol = this->fCurCol + XVar2;
      XMLBuffer::append(toFill,this->fCharBuf + XVar4,XVar2);
    }
    if ((this->fCharIndex < this->fCharsAvail) || (bVar1 = refreshCharBuffer(this), !bVar1)) {
      return toFill->fIndex != 0;
    }
    XVar4 = this->fCharIndex;
  } while( true );
}

Assistant:

bool XMLReader::getName(XMLBuffer& toFill, const bool token)
{
    //  Ok, first lets see if we have chars in the buffer. If not, then lets
    //  reload.
    if (fCharIndex == fCharsAvail)
    {
        if (!refreshCharBuffer())
            return false;
    }

    XMLSize_t charIndex_start = fCharIndex;

    //  Lets check the first char for being a first name char. If not, then
    //  what's the point in living mannnn? Just give up now. We only do this
    //  if its a name and not a name token that they want.
    if (!token)
    {
        if ((fCharBuf[fCharIndex] >= 0xD800) && (fCharBuf[fCharIndex] <= 0xDB7F)) {
            // if there isn't one more char in the buffer, read more data
            if (fCharIndex+1 == fCharsAvail)
            {
                if (!refreshCharBuffer())
                    return false;
                // reset the start buffer to the new location of the cursor
                charIndex_start = fCharIndex;
            }
            if ((fCharBuf[fCharIndex+1] < 0xDC00) || (fCharBuf[fCharIndex+1] > 0xDFFF))
                return false;

            // Looks ok, so lets eat it
            fCharIndex += 2;
        }
        else {
            if (!isFirstNameChar(fCharBuf[fCharIndex]))
                return false;

            // Looks ok, so lets eat it
            fCharIndex ++;
        }

    }

    //  And now we loop until we run out of data in this reader or we hit
    //  a non-name char.
    while (true)
    {
        while (fCharIndex < fCharsAvail)
        {
            //  Check the current char and take it if its a name char. Else
            //  break out.
            if ( (fCharBuf[fCharIndex] >= 0xD800) && (fCharBuf[fCharIndex] <= 0xDB7F) )
            {
                // if there isn't one more char in the buffer, read more data
                if (fCharIndex+1 == fCharsAvail)
                {
                    // but first copy the accepted character(s), and update column
                    if (fCharIndex != charIndex_start)
                    {
                        fCurCol += (XMLFileLoc)(fCharIndex - charIndex_start);
                        toFill.append(&fCharBuf[charIndex_start], fCharIndex - charIndex_start);
                    }

                    if (!refreshCharBuffer())
                        break;

                    charIndex_start = fCharIndex;
                }
                if ( (fCharBuf[fCharIndex+1] < 0xDC00) ||
                        (fCharBuf[fCharIndex+1] > 0xDFFF)  )
                    break;
                fCharIndex += 2;

            }
            else
            {
                if (!isNameChar(fCharBuf[fCharIndex]))
                    break;
                fCharIndex++;
            }
        }

        // we have to copy the accepted character(s), and update column
        if (fCharIndex != charIndex_start)
        {
            fCurCol += (XMLFileLoc)(fCharIndex - charIndex_start);
            toFill.append(&fCharBuf[charIndex_start], fCharIndex - charIndex_start);
        }

        // something is wrong if there is still something in the buffer
        // or if we don't get no more, then break out.
        if ((fCharIndex < fCharsAvail) ||
             !refreshCharBuffer())
            break;

        charIndex_start = fCharIndex;
    }

    return !toFill.isEmpty();
}